

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O0

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  buffers_iterator<boost::asio::const_buffer,_char> __last;
  size_t in_stack_fffffffffffffe78;
  difference_type size;
  error_t r;
  error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value_local;
  extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this_local;
  
  r.str.field_2._8_8_ = value;
  extracts::error_t::error_t((error_t *)&size);
  __last.position_ = in_stack_fffffffffffffe78;
  __last._0_48_ = *(undefined1 (*) [48])(r.str.field_2._8_8_ + 0x40);
  std::distance<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
            (*(buffers_iterator<boost::asio::const_buffer,_char> *)(r.str.field_2._8_8_ + 8),__last)
  ;
  std::__cxx11::string::reserve((ulong)&size);
  std::__cxx11::string::append<boost::asio::buffers_iterator<boost::asio::const_buffer,char>,void>
            ((string *)&size,
             *(buffers_iterator<boost::asio::const_buffer,_char> *)r.str.field_2._8_8_,
             *(buffers_iterator<boost::asio::const_buffer,_char> *)(r.str.field_2._8_8_ + 0x38));
  boost::
  variant<long,_bredis::extracts::string_t,_bredis::extracts::error_t,_bredis::extracts::nil_t,_boost::recursive_wrapper<bredis::extracts::array_holder_t>_>
  ::variant<bredis::extracts::error_t>(__return_storage_ptr__,(error_t *)&size,true);
  extracts::error_t::~error_t((error_t *)&size);
  return __return_storage_ptr__;
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::error_t<Iterator> &value) const {
        extracts::error_t r;
        auto size = std::distance(value.string.from, value.string.to);
        r.str.reserve(size);
        r.str.append(value.string.from, value.string.to);
        return r;
    }